

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_common.h
# Opt level: O3

istreambuf_iterator<char,_std::char_traits<char>_> *
date::skip_spaces<std::istreambuf_iterator<char,std::char_traits<char>>>
          (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
          istreambuf_iterator<char,_std::char_traits<char>_> *end)

{
  ulong uVar1;
  char *pcVar2;
  streambuf_type *psVar3;
  int_type iVar4;
  int_type iVar5;
  ulong uVar6;
  
  iVar4 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(pos);
  iVar5 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(end);
  if ((iVar4 == -1) != (iVar5 == -1)) {
    do {
      iVar4 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(pos);
      if ((char)iVar4 != ' ') {
        uVar6 = 0xffffffffffffffff;
        do {
          if (uVar6 == 4) {
            return pos;
          }
          uVar1 = uVar6 + 1;
          pcVar2 = &DAT_0010a072 + uVar6;
          uVar6 = uVar1;
        } while (*pcVar2 != (char)iVar4);
        if (4 < uVar1) {
          return pos;
        }
      }
      psVar3 = pos->_M_sbuf;
      if (*(ulong *)(psVar3 + 0x10) < *(ulong *)(psVar3 + 0x18)) {
        *(ulong *)(psVar3 + 0x10) = *(ulong *)(psVar3 + 0x10) + 1;
      }
      else {
        (**(code **)(*(long *)psVar3 + 0x50))();
      }
      pos->_M_c = -1;
      iVar4 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(pos);
      iVar5 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(end);
    } while ((iVar5 == -1) != (iVar4 == -1));
  }
  return pos;
}

Assistant:

Iterator& skip_spaces(Iterator& pos, const Iterator& end)
{
    using char_type = typename iterator_traits<Iterator>::value_type;
    for (; pos != end; ++pos)
    {
        const char_type ch = *pos;
        constexpr auto spaces = make_static_string<char_type>(" \t\n\v\f\r");
        if (!spaces.contains(ch))
            break;
    }
    return pos;
}